

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlCreateFileParserCtxt(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 local_38;
  char *filename;
  xmlParserCtxtPtr c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"z:xmlCreateFileParserCtxt",&local_38);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    filename = (char *)xmlCreateFileParserCtxt(local_38);
    self_local = libxml_xmlParserCtxtPtrWrap((xmlParserCtxtPtr)filename);
  }
  return self_local;
}

Assistant:

XML_POP_WARNINGS

PyObject *
libxml_xmlCreateFileParserCtxt(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlParserCtxtPtr c_retval;
    char * filename;

    if (!PyArg_ParseTuple(args, (char *)"z:xmlCreateFileParserCtxt", &filename))
        return(NULL);

    c_retval = xmlCreateFileParserCtxt(filename);
    py_retval = libxml_xmlParserCtxtPtrWrap((xmlParserCtxtPtr) c_retval);
    return(py_retval);
}